

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  int iVar1;
  double doubleval;
  ULONGLONG ulongval;
  LONGLONG longval;
  int *status_local;
  char *comm_local;
  void *value_local;
  char *keyname_local;
  fitsfile *pfStack_18;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    longval = (LONGLONG)status;
    status_local = (int *)comm;
    comm_local = (char *)value;
    value_local = keyname;
    keyname_local._4_4_ = datatype;
    pfStack_18 = fptr;
    if (datatype == 0x10) {
      ffgkys(fptr,keyname,(char *)value,comm,status);
    }
    else if (datatype == 0xb) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x100) && (-1 < (long)ulongval)) {
          *comm_local = (char)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0xc) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x80) && (-0x81 < (long)ulongval)) {
          *comm_local = (char)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0x14) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x10000) && (-1 < (long)ulongval)) {
          *(short *)comm_local = (short)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0x15) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x8000) && (-0x8001 < (long)ulongval)) {
          *(short *)comm_local = (short)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0x1e) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x100000000) && (-1 < (long)ulongval)) {
          *(int *)comm_local = (int)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0x1f) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if (((long)ulongval < 0x80000000) && (-0x80000001 < (long)ulongval)) {
          *(int *)comm_local = (int)ulongval;
        }
        else {
          *(undefined4 *)longval = 0x19c;
        }
      }
    }
    else if (datatype == 0xe) {
      ffgkyl(fptr,keyname,(int *)value,comm,status);
    }
    else if (datatype == 0x28) {
      iVar1 = ffgkyujj(fptr,keyname,(ULONGLONG *)&doubleval,comm,status);
      if (iVar1 < 1) {
        *(double *)comm_local = doubleval;
      }
    }
    else if (datatype == 0x29) {
      iVar1 = ffgkyjj(fptr,keyname,(LONGLONG *)&ulongval,comm,status);
      if (iVar1 < 1) {
        if ((long)ulongval < -0x8000000000000000) {
          *(undefined4 *)longval = 0x19c;
        }
        else {
          *(ULONGLONG *)comm_local = ulongval;
        }
      }
    }
    else if (datatype == 0x50) {
      ffgkyujj(fptr,keyname,(ULONGLONG *)value,comm,status);
    }
    else if (datatype == 0x51) {
      ffgkyjj(fptr,keyname,(LONGLONG *)value,comm,status);
    }
    else if (datatype == 0x2a) {
      ffgkye(fptr,keyname,(float *)value,comm,status);
    }
    else if (datatype == 0x52) {
      ffgkyd(fptr,keyname,(double *)value,comm,status);
    }
    else if (datatype == 0x53) {
      ffgkyc(fptr,keyname,(float *)value,comm,status);
    }
    else if (datatype == 0xa3) {
      ffgkym(fptr,keyname,(double *)value,comm,status);
    }
    else {
      *status = 0x19a;
    }
    fptr_local._4_4_ = *(int *)longval;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,      /* I - name of keyword to read  */
           void *value,        /* O - keyword value            */
           char *comm,         /* O - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Read (get) the keyword value and comment from the FITS header.
  Reads a keyword value with the datatype specified by the 2nd argument.
*/
{
    LONGLONG longval;
    ULONGLONG ulongval;
    double doubleval;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffgkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > UCHAR_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned char *) value = (unsigned char) longval;
        }
    }
    else if (datatype == TSBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > 127 || longval < -128)
                *status = NUM_OVERFLOW;
            else
                *(signed char *) value = (signed char) longval;
        }
    }
    else if (datatype == TUSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned short) USHRT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned short *) value = (unsigned short) longval;
        }
    }
    else if (datatype == TSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > SHRT_MAX || longval < SHRT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(short *) value = (short) longval;
        }
    }
    else if (datatype == TUINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned int) UINT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned int *) value = longval;
        }
    }
    else if (datatype == TINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > INT_MAX || longval < INT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(int *) value = longval;
        }
    }
    else if (datatype == TLOGICAL)
    {
        ffgkyl(fptr, keyname, (int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        if (ffgkyujj(fptr, keyname, &ulongval, comm, status) <= 0)
        {
            if (ulongval > ULONG_MAX)
                *status = NUM_OVERFLOW;
            else
                 *(unsigned long *) value = ulongval;
        }
    }
    else if (datatype == TLONG)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > LONG_MAX || longval < LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *(long *) value = longval;
        }
    }
    else if (datatype == TULONGLONG)
    {
        ffgkyujj(fptr, keyname, (ULONGLONG *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgkyjj(fptr, keyname, (LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgkye(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgkyd(fptr, keyname, (double *) value, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffgkyc(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffgkym(fptr, keyname, (double *) value, comm, status);
    }
    else
        *status = BAD_DATATYPE;

    return(*status);
}